

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::RepeatedStringView::
GenerateSerializeWithCachedSizesToArray(RepeatedStringView *this,Printer *p)

{
  anon_class_1_0_00000001 local_109;
  long *local_108;
  undefined8 local_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  undefined8 uStack_f0;
  Printer *local_e8;
  long *local_e0;
  undefined8 local_d8;
  long local_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [24];
  code *local_a8;
  byte local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined1 local_78;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_70;
  
  local_108 = (long *)&local_f8;
  local_e8 = p;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"utf8_check","");
  local_e0 = &local_d0;
  if (local_108 == (long *)&local_f8) {
    uStack_c8 = uStack_f0;
  }
  else {
    local_e0 = local_108;
  }
  local_d0 = CONCAT71(uStack_f7,local_f8);
  local_d8 = local_100;
  local_100 = 0;
  local_f8 = 0;
  local_108 = (long *)&local_f8;
  local_c0._0_8_ = operator_new(0x18);
  *(Printer ***)local_c0._0_8_ = &local_e8;
  *(RepeatedStringView **)(local_c0._0_8_ + 8) = this;
  *(undefined1 *)(local_c0._0_8_ + 0x10) = 0;
  local_a8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  local_c0._8_8_ = 0;
  local_c0._16_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_a0 = 1;
  local_90 = 0;
  local_88 = 0;
  local_78 = 0;
  local_98 = &local_88;
  std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)0x0,0x522f0c);
  local_70._M_engaged = false;
  io::Printer::Emit(p,&local_e0,1,0x10a,
                    "\n            for (int i = 0, n = this_._internal_$name$_size(); i < n; ++i) {\n              const auto& s = this_._internal_$name$().Get(i);\n              $utf8_check$;\n              target = stream->Write$DeclaredType$($number$, s, target);\n            }\n          "
                   );
  if (local_70._M_engaged == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_70);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_a0]._M_data)
            (&local_109,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)local_c0);
  local_a0 = 0xff;
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_108 != (long *)&local_f8) {
    operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
  }
  return;
}

Assistant:

void RepeatedStringView::GenerateSerializeWithCachedSizesToArray(
    io::Printer* p) const {
  p->Emit({{"utf8_check",
            [&] {
              GenerateUtf8CheckCodeForString(
                  p, field_, options_, false,
                  "s.data(), static_cast<int>(s.length()),");
            }}},
          R"cc(
            for (int i = 0, n = this_._internal_$name$_size(); i < n; ++i) {
              const auto& s = this_._internal_$name$().Get(i);
              $utf8_check$;
              target = stream->Write$DeclaredType$($number$, s, target);
            }
          )cc");
}